

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O0

void __thiscall
nuraft::asio_rpc_client::connected
          (asio_rpc_client *this,ptr<req_msg> *req,rpc_handler *when_done,uint64_t send_timeout_ms,
          error_code err,iterator *itor)

{
  bool bVar1;
  int iVar2;
  int32 iVar3;
  element_type *peVar4;
  undefined8 uVar5;
  element_type *this_00;
  function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
  *this_01;
  error_code *this_02;
  shared_ptr<nuraft::req_msg> *args_1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  ptr<rpc_exception> except;
  ptr<resp_msg> rsp;
  undefined8 in_stack_fffffffffffffe18;
  undefined1 __i;
  _Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>
  *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  handshake_type in_stack_fffffffffffffe2c;
  stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>
  *in_stack_fffffffffffffe30;
  shared_ptr<nuraft::req_msg> *in_stack_fffffffffffffe38;
  asio_rpc_client **in_stack_fffffffffffffe40;
  error_code *this_03;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  strfmt<100> *in_stack_fffffffffffffe50;
  _Placeholder<1> *in_stack_fffffffffffffe60;
  string local_180 [32];
  strfmt<100> local_160;
  shared_ptr<nuraft::req_msg> *local_f0;
  code *local_c0;
  undefined8 local_b8;
  string local_50 [32];
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  error_code local_10;
  
  __i = (undefined1)((ulong)in_stack_fffffffffffffe18 >> 0x38);
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  bVar1 = std::error_code::operator_cast_to_bool(&local_10);
  if (bVar1) {
    std::atomic<bool>::operator=((atomic<bool> *)in_stack_fffffffffffffe20,(bool)__i);
    std::shared_ptr<nuraft::resp_msg>::shared_ptr((shared_ptr<nuraft::resp_msg> *)0x262b59);
    strfmt<100>::strfmt(&local_160,"failed to connect to peer %d, %s:%s, error %d, %s");
    this_00 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x262b7c);
    iVar3 = msg_base::get_dst(&this_00->super_msg_base);
    this_01 = (function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
               *)std::__cxx11::string::c_str();
    this_02 = (error_code *)std::__cxx11::string::c_str();
    this_03 = &local_10;
    iVar2 = std::error_code::value(this_03);
    std::error_code::message_abi_cxx11_(this_02);
    std::__cxx11::string::c_str();
    args_1 = (shared_ptr<nuraft::req_msg> *)
             strfmt<100>::fmt<int,char_const*,char_const*,int,char_const*>
                       (in_stack_fffffffffffffe50,iVar2,(char *)this_03,(char *)this_02,
                        (int)((ulong)this_01 >> 0x20),
                        (char *)CONCAT44(iVar3,in_stack_fffffffffffffe28));
    local_f0 = args_1;
    cs_new<nuraft::rpc_exception,char_const*,std::shared_ptr<nuraft::req_msg>&>
              ((char **)CONCAT44(iVar3,in_stack_fffffffffffffe28),args_1);
    std::__cxx11::string::~string(local_180);
    std::
    function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>::
    operator()(this_01,(shared_ptr<nuraft::resp_msg> *)CONCAT44(iVar3,in_stack_fffffffffffffe28),
               (shared_ptr<nuraft::rpc_exception> *)args_1);
    std::shared_ptr<nuraft::rpc_exception>::~shared_ptr
              ((shared_ptr<nuraft::rpc_exception> *)0x262c71);
    std::shared_ptr<nuraft::resp_msg>::~shared_ptr((shared_ptr<nuraft::resp_msg> *)0x262c7e);
  }
  else {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x62));
    if (bVar1) {
      peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x26295c);
      iVar2 = (**(code **)(*(long *)peVar4 + 0x38))();
      if (3 < iVar2) {
        peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x26297f);
        in_stack_fffffffffffffe60 = (_Placeholder<1> *)std::__cxx11::string::c_str();
        uVar5 = std::__cxx11::string::c_str();
        msg_if_given_abi_cxx11_
                  ((char *)local_50,"%p connected to %s:%s (as a client)",in_RDI,
                   in_stack_fffffffffffffe60,uVar5);
        (**(code **)(*(long *)peVar4 + 0x40))
                  (peVar4,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                   ,"connected",0x528,local_50);
        std::__cxx11::string::~string(local_50);
      }
    }
    if ((*(byte *)(in_RDI + 0x4f) & 1) == 0) {
      (**(code **)(*in_RDI + 0x10))(in_RDI,local_20,local_28,local_30);
    }
    else {
      local_c0 = handle_handshake;
      local_b8 = 0;
      std::
      bind<void(nuraft::asio_rpc_client::*)(std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long,std::error_code_const&),nuraft::asio_rpc_client*,std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long&,std::_Placeholder<1>const&>
                ((offset_in_asio_rpc_client_to_subr *)
                 CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                 in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                 (function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                  *)in_stack_fffffffffffffe30,
                 (unsigned_long *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                 in_stack_fffffffffffffe60);
      asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>::
      async_handshake<std::_Bind<void(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client*,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,unsigned_long,std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long,std::error_code_const&)>>
                (in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,in_stack_fffffffffffffe20);
      std::
      _Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>
      ::~_Bind((_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>
                *)0x262ae6);
    }
  }
  return;
}

Assistant:

void connected(ptr<req_msg>& req,
                   rpc_handler& when_done,
                   uint64_t send_timeout_ms,
                   std::error_code err,
                   asio::ip::tcp::resolver::iterator itor)
    {
        if (!err) {
            p_in( "%p connected to %s:%s (as a client)",
                  this, host_.c_str(), port_.c_str() );
            if (ssl_enabled_) {
#ifdef SSL_LIBRARY_NOT_FOUND
                assert(0); // Should not reach here.
#else
                ssl_socket_.async_handshake
                    ( asio::ssl::stream_base::client,
                      std::bind( &asio_rpc_client::handle_handshake,
                                 this,
                                 req,
                                 when_done,
                                 send_timeout_ms,
                                 std::placeholders::_1 ) );
#endif
            } else {
                this->send(req, when_done, send_timeout_ms);
            }

        } else {
            abandoned_ = true;
            ptr<resp_msg> rsp;
            ptr<rpc_exception> except
                ( cs_new<rpc_exception>
                  ( sstrfmt("failed to connect to peer %d, %s:%s, error %d, %s")
                           .fmt( req->get_dst(), host_.c_str(),
                                 port_.c_str(), err.value(), err.message().c_str() ),
                    req ) );
            when_done(rsp, except);
        }
    }